

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Member.h
# Opt level: O1

string * __thiscall Address::getAddress_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  size_type *psVar1;
  short sVar2;
  uint uVar3;
  undefined8 uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong *puVar8;
  ulong uVar9;
  uint uVar10;
  uint __len;
  uint uVar11;
  string __str_1;
  string __str;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar3 = *(uint *)this->addr;
  uVar11 = -uVar3;
  if (0 < (int)uVar3) {
    uVar11 = uVar3;
  }
  __len = 1;
  if (9 < uVar11) {
    uVar9 = (ulong)uVar11;
    uVar10 = 4;
    do {
      __len = uVar10;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00102e3b;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00102e3b;
      }
      if (uVar7 < 10000) goto LAB_00102e3b;
      uVar9 = uVar9 / 10000;
      uVar10 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00102e3b:
  sVar2 = *(short *)(this->addr + 4);
  uVar10 = (uint)sVar2;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar3 >> 0x1f),__len,uVar11);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_60 = *puVar8;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar8;
    local_70 = (ulong *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar3 = -uVar10;
  if (0 < (int)uVar10) {
    uVar3 = uVar10;
  }
  uVar11 = 1;
  if (((9 < uVar3) && (uVar11 = 2, 99 < uVar3)) && (uVar11 = 3, 999 < uVar3)) {
    uVar11 = 5 - (uVar3 < 10000);
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar11 - (char)(sVar2 >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar10 >> 0x1f) + (long)local_90),uVar11,uVar3);
  uVar9 = 0xf;
  if (local_70 != &local_60) {
    uVar9 = local_60;
  }
  if (uVar9 < (ulong)(local_88 + local_68)) {
    uVar9 = 0xf;
    if (local_90 != local_80) {
      uVar9 = local_80[0];
    }
    if ((ulong)(local_88 + local_68) <= uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_00102f95;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_00102f95:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar4 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string getAddress() {
		int id = 0;
		short port;
		memcpy(&id, &addr[0], sizeof(int));
		memcpy(&port, &addr[4], sizeof(short));
		return to_string(id) + ":" + to_string(port);
	}